

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFMatrix<long>::CheckTypeCompatibility
          (TPZFMatrix<long> *this,TPZMatrix<long> *A,TPZMatrix<long> *B)

{
  long lVar1;
  bool bVar2;
  
  if (A == (TPZMatrix<long> *)0x0) {
    bVar2 = false;
  }
  else {
    lVar1 = __dynamic_cast(A,&TPZMatrix<long>::typeinfo,&typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  if (B != (TPZMatrix<long> *)0x0) {
    lVar1 = __dynamic_cast(B,&TPZMatrix<long>::typeinfo,&typeinfo,0);
    if ((bool)(bVar2 & lVar1 != 0)) {
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZFMatrix<long>::CheckTypeCompatibility(const TPZMatrix<TVar> *, const TPZMatrix<TVar> *) const [TVar = long]"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: incompatible matrices.Aborting...\n",0x2a);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x1cb);
}

Assistant:

inline void CheckTypeCompatibility(const TPZMatrix<TVar>*A,
                                       const TPZMatrix<TVar>*B)const override
    {
        auto aPtr = dynamic_cast<const TPZFMatrix<TVar>*>(A);
        auto bPtr = dynamic_cast<const TPZFMatrix<TVar>*>(B);
        if(!aPtr || !bPtr){
            PZError<<__PRETTY_FUNCTION__;
            PZError<<"\nERROR: incompatible matrices.Aborting...\n";
            DebugStop();
        }
    }